

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  char *pcVar1;
  byte *pbVar2;
  sqlite3_index_orderby *psVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  WhereInfo *pWVar7;
  WhereClause *pWVar8;
  SrcList *pSVar9;
  ExprList *pEVar10;
  Table *pTVar11;
  Expr *pEVar12;
  Column *pCVar13;
  Bitmask BVar14;
  int iVar15;
  uint uVar16;
  char *pcVar17;
  sqlite3_index_info *pIdxInfo;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  Bitmask *pBVar21;
  long lVar22;
  char *pcVar23;
  uint uVar24;
  u16 mNoOmit;
  WhereInfo *pWVar25;
  uint uVar26;
  WhereInfo *pWVar27;
  anon_union_8_3_bb5b150a_for_u *paVar28;
  int iVar29;
  ulong uVar30;
  int iVar31;
  ulong uVar32;
  long lVar33;
  u8 uVar34;
  ushort uVar35;
  uint uVar36;
  Expr *pEVar37;
  int iVar38;
  WhereLoop *p;
  ulong uVar39;
  Parse *pParse;
  long lVar40;
  sqlite3_index_constraint *psVar41;
  ulong uVar42;
  bool bVar43;
  ulong local_98;
  int bRetry;
  Bitmask local_78;
  WhereLoop *local_70;
  Parse *local_68;
  int bIn;
  code *local_58;
  code *local_50;
  u16 local_3c;
  
  bRetry = 0;
  pWVar7 = pBuilder->pWInfo;
  pWVar8 = pBuilder->pWC;
  local_68 = pWVar7->pParse;
  pSVar9 = pWVar7->pTabList;
  local_70 = pBuilder->pNew;
  bVar4 = local_70->iTab;
  pEVar10 = pWVar7->pOrderBy;
  pTVar11 = pSVar9->a[bVar4].pTab;
  iVar15 = pWVar8->nTerm;
  uVar16 = 0;
  if (iVar15 < 1) {
    lVar40 = 0;
  }
  else {
    iVar38 = pSVar9->a[bVar4].iCursor;
    pBVar21 = &pWVar8->a->prereqRight;
    iVar29 = 0;
    do {
      uVar6 = *(u16 *)((long)pBVar21 + -0x16);
      *(ushort *)((long)pBVar21 + -0x16) = uVar6 & 0xffbf;
      if (((*(int *)((long)pBVar21 + -0xc) == iVar38) && ((*pBVar21 & mUnusable) == 0)) &&
         (-1 < (char)uVar6 && (*pBVar21 & 0xf7ff00000000) != 0)) {
        bVar5 = pSVar9->a[bVar4].fg.jointype;
        if ((bVar5 & 0x58) != 0) {
          uVar24 = ((WhereTerm *)(pBVar21 + -5))->pExpr->flags;
          if ((((uVar24 & 3) == 0) || ((((WhereTerm *)(pBVar21 + -5))->pExpr->w).iJoin != iVar38))
             || (((bVar5 & 0x18) != 0 && ((uVar24 & 2) != 0)))) goto LAB_0018c6a5;
        }
        iVar29 = iVar29 + 1;
        *(ushort *)((long)pBVar21 + -0x16) = uVar6 | 0x40;
      }
LAB_0018c6a5:
      pBVar21 = pBVar21 + 7;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    lVar40 = (long)iVar29;
  }
  pWVar25 = pWVar7;
  uVar24 = 0;
  local_78 = mPrereq;
  if (pEVar10 != (ExprList *)0x0) {
    uVar36 = pEVar10->nExpr;
    pWVar25 = (WhereInfo *)(long)(int)uVar36;
    uVar16 = 0;
    uVar26 = 0;
    if (0 < (long)pWVar25) {
      pWVar27 = (WhereInfo *)0x0;
      do {
        pEVar37 = pEVar10->a[(long)pWVar27].pExpr;
        local_3c = 1;
        _bIn = (Parse *)0x0;
        local_58 = exprNodeIsConstant;
        local_50 = sqlite3SelectWalkFail;
        if (pEVar37 != (Expr *)0x0) {
          sqlite3WalkExprNN((Walker *)&bIn,pEVar37);
        }
        iVar15 = 7;
        if (local_3c == 0) {
          if ((pEVar10->a[(long)pWVar27].fg.sortFlags & 2) == 0) {
            if (pEVar37->op == 'q') {
              pEVar12 = pEVar37->pLeft;
              if ((pEVar12->op == 0xa7) && (pEVar12->iTable == pSVar9->a[bVar4].iCursor)) {
                pEVar37->iColumn = pEVar12->iColumn;
                lVar22 = (long)pEVar12->iColumn;
                if (lVar22 < 0) {
                  bVar20 = false;
                  iVar15 = 7;
                }
                else {
                  pCVar13 = pTVar11->aCol;
                  uVar6 = pCVar13[lVar22].colFlags;
                  if ((uVar6 >> 9 & 1) == 0) {
                    pcVar17 = (char *)0x0;
                  }
                  else {
                    pcVar17 = pCVar13[lVar22].zCnName + -1;
                    do {
                      pcVar23 = pcVar17 + 1;
                      pcVar17 = pcVar17 + 1;
                    } while (*pcVar23 != '\0');
                    pcVar23 = pcVar17;
                    if ((uVar6 & 4) != 0) {
                      do {
                        pcVar17 = pcVar23 + 1;
                        pcVar1 = pcVar23 + 1;
                        pcVar23 = pcVar17;
                      } while (*pcVar1 != '\0');
                    }
                    pcVar17 = pcVar17 + 1;
                  }
                  if ((pEVar37->u).zToken != (char *)0x0) {
                    if (pcVar17 == (char *)0x0) {
                      pcVar17 = "BINARY";
                    }
                    lVar22 = 0;
                    do {
                      bVar5 = (pEVar37->u).zToken[lVar22];
                      bVar43 = bVar5 == pcVar17[lVar22];
                      if (bVar43) {
                        if ((ulong)bVar5 == 0) goto LAB_0018c86a;
                      }
                      else if (""[bVar5] != ""[(byte)pcVar17[lVar22]]) goto LAB_0018c86a;
                      lVar22 = lVar22 + 1;
                    } while( true );
                  }
                  bVar43 = false;
LAB_0018c86a:
                  bVar20 = (bool)(bVar43 ^ 1);
                  iVar15 = 0;
                  if (bVar43) {
                    iVar15 = 7;
                  }
                }
                if (!bVar20) goto LAB_0018c888;
              }
            }
            else if ((pEVar37->op == 0xa7) && (pEVar37->iTable == pSVar9->a[bVar4].iCursor))
            goto LAB_0018c888;
          }
          iVar15 = 5;
        }
LAB_0018c888:
        if (iVar15 != 7) goto LAB_0018c89b;
        pWVar27 = (WhereInfo *)((long)&pWVar27->pParse + 1);
      } while (pWVar27 != pWVar25);
      pWVar27 = (WhereInfo *)(ulong)uVar36;
LAB_0018c89b:
      uVar26 = (uint)pWVar27;
    }
    uVar24 = 0;
    if (uVar26 == uVar36) {
      uVar6 = pWVar7->wctrlFlags;
      uVar24 = uVar36;
      if (((char)uVar6 < '\0') && ((pSVar9->a[bVar4].fg.field_0x2 & 0x40) == 0)) {
        uVar16 = uVar6 >> 9 & 1 | 2;
      }
      else {
        uVar16 = uVar6 >> 6 & 1;
      }
    }
  }
  pParse = local_68;
  p = local_70;
  mNoOmit = (u16)pWVar25;
  lVar22 = (long)(int)uVar24;
  pIdxInfo = (sqlite3_index_info *)
             sqlite3DbMallocZero(local_68->db,lVar40 * 0x1c + lVar22 * 8 + 0x88);
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    pIdxInfo = (sqlite3_index_info *)0x0;
    sqlite3ErrorMsg(pParse,"out of memory");
  }
  else {
    psVar41 = (sqlite3_index_constraint *)(&pIdxInfo[1].aConstraintUsage + lVar40);
    psVar3 = (sqlite3_index_orderby *)((long)&pIdxInfo[1].aConstraintUsage + lVar40 * 0x14);
    pIdxInfo->aConstraint = psVar41;
    pIdxInfo->aOrderBy = psVar3;
    pIdxInfo->aConstraintUsage = (sqlite3_index_constraint_usage *)(psVar3 + lVar22);
    *(WhereClause **)(pIdxInfo + 1) = pWVar8;
    pIdxInfo[1].aConstraint = (sqlite3_index_constraint *)pParse;
    pIdxInfo[1].nOrderBy = uVar16;
    *(undefined4 *)&pIdxInfo[1].field_0x14 = 0;
    iVar15 = pWVar8->nTerm;
    iVar38 = 0;
    if (iVar15 < 1) {
      mNoOmit = 0;
      iVar29 = 0;
    }
    else {
      paVar28 = &pWVar8->a->u;
      iVar31 = 0;
      iVar29 = 0;
      uVar16 = 0;
      do {
        uVar6 = *(u16 *)((long)paVar28 + -0xe);
        if ((uVar6 & 0x40) != 0) {
          lVar33 = (long)iVar29;
          psVar41[lVar33].iColumn = (paVar28->x).leftColumn;
          (&pIdxInfo[1].idxNum)[lVar40 * 2 + lVar33 * 3] = iVar31;
          uVar35 = *(u16 *)((long)paVar28 + -0xc) & 0x3fff;
          if ((uVar35 == 1) && (uVar35 = 2, -1 < (short)uVar6)) {
            uVar36 = 1 << ((byte)iVar29 & 0x1f);
            if (0x1f < iVar29) {
              uVar36 = 0;
            }
            *(uint *)&pIdxInfo[1].field_0x14 = *(uint *)&pIdxInfo[1].field_0x14 | uVar36;
          }
          if (uVar35 == 0x40) {
            uVar34 = *(u8 *)((long)paVar28 + -9);
LAB_0018c9f9:
            psVar41[lVar33].op = uVar34;
          }
          else {
            if ((uVar35 & 0x180) != 0) {
              uVar34 = 'H' - (uVar35 == 0x100);
              goto LAB_0018c9f9;
            }
            psVar41[lVar33].op = (uchar)uVar35;
            if ((uVar35 & 0x3c) != 0) {
              pEVar37 = ((WhereTerm *)(paVar28 + -4))->pExpr->pRight;
              uVar34 = pEVar37->op;
              if (uVar34 == 0xb0) {
                uVar34 = pEVar37->op2;
              }
              if (uVar34 != 0xb1) {
                if (uVar34 != 0x8a) goto LAB_0018c9fd;
                pEVar37 = (Expr *)(pEVar37->x).pList;
              }
              if (1 < ((pEVar37->x).pList)->nExpr) {
                uVar36 = 1 << ((byte)iVar29 & 0x1f);
                if (0xf < iVar29) {
                  uVar36 = 0;
                }
                uVar16 = uVar16 | uVar36;
                if (uVar35 == 0x10) {
                  uVar34 = '\b';
                }
                else {
                  if (uVar35 != 4) goto LAB_0018c9fd;
                  uVar34 = ' ';
                }
                goto LAB_0018c9f9;
              }
            }
          }
LAB_0018c9fd:
          iVar29 = iVar29 + 1;
        }
        mNoOmit = (u16)uVar16;
        iVar31 = iVar31 + 1;
        paVar28 = paVar28 + 7;
      } while (iVar15 != iVar31);
    }
    pIdxInfo->nConstraint = iVar29;
    if (0 < (int)uVar24) {
      lVar33 = 0;
      iVar38 = 0;
      do {
        pEVar37 = *(Expr **)((long)&pEVar10->a[0].pExpr + lVar33);
        local_3c = 1;
        _bIn = (Parse *)0x0;
        local_58 = exprNodeIsConstant;
        local_50 = sqlite3SelectWalkFail;
        if (pEVar37 != (Expr *)0x0) {
          sqlite3WalkExprNN((Walker *)&bIn,pEVar37);
        }
        if (local_3c == 0) {
          psVar3[iVar38].iColumn = (int)pEVar37->iColumn;
          *(byte *)((long)&pIdxInfo[1].aConstraintUsage + (long)iVar38 * 8 + lVar40 * 0x14 + 4) =
               (&pEVar10->a[0].fg.sortFlags)[lVar33] & 1;
          iVar38 = iVar38 + 1;
        }
        lVar33 = lVar33 + 0x18;
      } while (lVar22 * 0x18 != lVar33);
    }
    pIdxInfo->nOrderBy = iVar38;
    p = local_70;
    pParse = local_68;
  }
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    iVar15 = 7;
  }
  else {
    p->rSetup = 0;
    p->wsFlags = 0x400;
    p->nLTerm = 0;
    pbVar2 = (byte *)((long)&p->u + 4);
    *pbVar2 = *pbVar2 & 0xfe;
    uVar16 = pIdxInfo->nConstraint;
    iVar38 = whereLoopResize(pParse->db,p,uVar16);
    BVar14 = local_78;
    iVar15 = 7;
    if (iVar38 == 0) {
      iVar15 = whereLoopAddVirtualOne
                         (pBuilder,local_78,0xffffffffffffffff,0,pIdxInfo,mNoOmit,&bIn,&bRetry);
      if (bRetry != 0) {
        iVar15 = whereLoopAddVirtualOne
                           (pBuilder,BVar14,0xffffffffffffffff,0,pIdxInfo,mNoOmit,&bIn,(int *)0x0);
      }
      pParse = local_68;
      if (iVar15 == 0) {
        uVar42 = ~BVar14;
        uVar18 = p->prereq & uVar42;
        iVar15 = 0;
        if (bIn != 0 || uVar18 != 0) {
          if (bIn == 0) {
            iVar15 = 0;
            bVar43 = false;
            local_98 = 0;
          }
          else {
            iVar15 = whereLoopAddVirtualOne
                               (pBuilder,BVar14,0xffffffffffffffff,1,pIdxInfo,mNoOmit,&bIn,
                                (int *)0x0);
            local_98 = p->prereq & uVar42;
            bVar43 = local_98 == 0;
          }
          uVar39 = 0;
          bVar20 = bVar43;
          do {
            BVar14 = local_78;
            if (iVar15 != 0) break;
            if ((int)uVar16 < 1) {
              uVar19 = 0xffffffffffffffff;
            }
            else {
              uVar19 = 0xffffffffffffffff;
              lVar40 = 0;
              do {
                uVar30 = pWVar8->a[*(int *)((long)&pIdxInfo->aConstraint->iTermOffset + lVar40)].
                         prereqRight & uVar42;
                uVar32 = uVar19;
                if (uVar30 < uVar19) {
                  uVar32 = uVar30;
                }
                if (uVar39 < uVar30) {
                  uVar19 = uVar32;
                }
                lVar40 = lVar40 + 0xc;
              } while ((ulong)uVar16 * 0xc != lVar40);
            }
            iVar15 = 0;
            if ((((uVar19 != 0xffffffffffffffff) && (uVar19 != uVar18)) &&
                (iVar15 = 0, uVar19 != local_98)) &&
               (iVar15 = whereLoopAddVirtualOne
                                   (pBuilder,local_78,uVar19 | local_78,0,pIdxInfo,mNoOmit,&bIn,
                                    (int *)0x0), local_70->prereq == BVar14)) {
              bVar43 = true;
              if (bIn == 0) {
                bVar20 = true;
              }
            }
            uVar39 = uVar19;
          } while (uVar19 != 0xffffffffffffffff);
          BVar14 = local_78;
          if (!bVar43 && iVar15 == 0) {
            iVar15 = whereLoopAddVirtualOne
                               (pBuilder,local_78,local_78,0,pIdxInfo,mNoOmit,&bIn,(int *)0x0);
            if (bIn == 0) {
              bVar20 = true;
            }
          }
          if (!bVar20 && iVar15 == 0) {
            iVar15 = whereLoopAddVirtualOne
                               (pBuilder,BVar14,BVar14,1,pIdxInfo,mNoOmit,&bIn,(int *)0x0);
          }
        }
      }
      if (pIdxInfo->needToFreeIdxStr != 0) {
        sqlite3_free(pIdxInfo->idxStr);
      }
    }
    freeIndexInfo(pParse->db,pIdxInfo);
  }
  return iVar15;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  SrcItem *pSrc;               /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;
  int bRetry = 0;              /* True to retry with LIMIT/OFFSET disabled */

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pWInfo, pWC, mUnusable, pSrc, &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    freeIndexInfo(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x800, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(
      pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, &bRetry
  );
  if( bRetry ){
    assert( rc==SQLITE_OK );
    rc = whereLoopAddVirtualOne(
        pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, 0
    );
  }

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x800, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn, 0);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq)
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x800, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn, 0);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  freeIndexInfo(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}